

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunchReporter.cxx
# Opt level: O2

void __thiscall cmCTestLaunchReporter::WriteXMLCommand(cmCTestLaunchReporter *this,cmXMLElement *e2)

{
  pointer pbVar1;
  string *realArg;
  pointer value;
  cmXMLElement e3;
  allocator<char> local_51;
  cmXMLElement local_50;
  string local_48;
  
  cmXMLElement::Comment(e2,"Details of command");
  cmXMLElement::cmXMLElement(&local_50,e2,"Command");
  if ((this->CWD)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"WorkingDirectory",&local_51);
    cmXMLWriter::Element<std::__cxx11::string>(local_50.xmlwr,&local_48,&this->CWD);
    std::__cxx11::string::~string((string *)&local_48);
  }
  pbVar1 = (this->RealArgs).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (value = (this->RealArgs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; value != pbVar1; value = value + 1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Argument",&local_51);
    cmXMLWriter::Element<std::__cxx11::string>(local_50.xmlwr,&local_48,value);
    std::__cxx11::string::~string((string *)&local_48);
  }
  cmXMLElement::~cmXMLElement(&local_50);
  return;
}

Assistant:

void cmCTestLaunchReporter::WriteXMLCommand(cmXMLElement& e2)
{
  e2.Comment("Details of command");
  cmXMLElement e3(e2, "Command");
  if (!this->CWD.empty()) {
    e3.Element("WorkingDirectory", this->CWD);
  }
  for (std::string const& realArg : this->RealArgs) {
    e3.Element("Argument", realArg);
  }
}